

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<int>::InsertSub
          (TPZMatrix<int> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<int> *pA)

{
  int iVar1;
  int64_t r;
  int64_t c;
  long lVar2;
  int64_t col;
  long lVar3;
  int local_54;
  int64_t local_50;
  long local_48;
  int64_t local_40;
  long local_38;
  
  local_38 = rowSize + pRow;
  local_50 = sRow;
  local_40 = sCol;
  if (local_38 <= (pA->super_TPZBaseMatrix).fRow) {
    local_48 = pCol;
    if (colSize + pCol <= (pA->super_TPZBaseMatrix).fCol) {
      for (; lVar2 = local_48, lVar3 = local_40, pRow < local_38; pRow = pRow + 1) {
        for (; lVar2 < colSize + pCol; lVar2 = lVar2 + 1) {
          local_54 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                               (this,local_50,lVar3);
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (pA,pRow,lVar2,&local_54);
          lVar3 = lVar3 + 1;
        }
        local_50 = local_50 + 1;
      }
      return 1;
    }
  }
  iVar1 = Error("InsertSub <the sub-matrix is too big that target>",(char *)0x0);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::InsertSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							   const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
	
	
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        return( Error( "InsertSub <the sub-matrix is too big that target>" ) );
    }
	
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}